

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O3

void __thiscall lunasvg::SVGUseElement::build(SVGUseElement *this)

{
  size_t *psVar1;
  _List_node_base *in_RAX;
  SVGElement *pSVar2;
  _List_node_base *p_Var3;
  _List_node_base *local_18;
  
  local_18 = in_RAX;
  pSVar2 = SVGURIReference::getTargetElement
                     (&this->super_SVGURIReference,
                      (this->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.m_document);
  if (pSVar2 != (SVGElement *)0x0) {
    cloneTargetElement((SVGUseElement *)&stack0xffffffffffffffe8,(SVGElement *)this);
    if (local_18 != (_List_node_base *)0x0) {
      local_18[1]._M_next = (_List_node_base *)this;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = local_18;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->super_SVGGraphicsElement).super_SVGElement.m_children.
                super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  SVGElement::build((SVGElement *)this);
  return;
}

Assistant:

void SVGUseElement::build()
{
    if(auto targetElement = getTargetElement(document())) {
        if(auto newElement = cloneTargetElement(targetElement)) {
            addChild(std::move(newElement));
        }
    }

    SVGGraphicsElement::build();
}